

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O1

bool duckdb::Glob(char *string,idx_t slen,char *pattern,idx_t plen,bool allow_question_mark)

{
  char cVar1;
  char cVar2;
  char cVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  idx_t slen_00;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  ulong uVar12;
  idx_t iVar13;
  byte bVar14;
  
  uVar6 = -slen;
  iVar7 = 0;
  uVar12 = 0;
  do {
    do {
      if ((slen <= uVar12) || (plen <= iVar7)) {
        uVar6 = iVar7;
        if (plen <= iVar7) goto LAB_014dcf43;
        goto LAB_014dcf31;
      }
      bVar14 = pattern[iVar7];
      iVar13 = uVar12;
      if (bVar14 < 0x5b) {
        if (bVar14 == 0x2a) {
          do {
            iVar13 = plen;
            if (plen - 1 == iVar7) break;
            iVar13 = iVar7 + 1;
            lVar4 = iVar7 + 1;
            iVar7 = iVar13;
          } while (pattern[lVar4] == '*');
          iVar7 = iVar13;
          uVar6 = 1;
          if (plen - iVar7 != 0) {
            slen_00 = slen - uVar12;
            if (uVar12 <= slen && slen_00 != 0) {
              do {
                iVar9 = 1;
                bVar5 = Glob(string + uVar12,slen_00,pattern + iVar7,plen - iVar7,true);
                uVar6 = (ulong)bVar5;
                if (bVar5) goto LAB_014dce2f;
                uVar12 = uVar12 + 1;
                slen_00 = slen_00 - 1;
                iVar13 = slen;
              } while (uVar12 != slen);
              goto LAB_014dce36;
            }
            uVar6 = 0;
          }
LAB_014dce2f:
          iVar9 = 1;
          iVar13 = uVar12;
        }
        else {
          if (bVar14 == 0x3f) {
            if (!allow_question_mark) goto LAB_014dcd77;
          }
          else {
LAB_014dcd84:
            if (string[uVar12] != bVar14) goto LAB_014dce29;
          }
LAB_014dcd8d:
          iVar7 = iVar7 + 1;
          iVar9 = 0;
          iVar13 = uVar12 + 1;
        }
      }
      else if (bVar14 == 0x5b) {
LAB_014dcd77:
        iVar7 = iVar7 + 1;
        iVar9 = 0xb;
      }
      else {
        if (bVar14 != 0x5c) goto LAB_014dcd84;
        iVar7 = iVar7 + 1;
        if ((iVar7 != plen) && (string[uVar12] == pattern[iVar7])) goto LAB_014dcd8d;
LAB_014dce29:
        iVar9 = 1;
        uVar6 = 0;
      }
LAB_014dce36:
      bVar14 = (byte)uVar6;
      uVar12 = iVar13;
    } while (iVar9 == 0);
    if (iVar9 != 0xb) break;
    if (iVar7 == plen) {
      bVar14 = 0;
      break;
    }
    cVar1 = pattern[iVar7];
    cVar2 = string[iVar13];
    uVar8 = (ulong)(cVar1 == '!');
    uVar10 = uVar8 + iVar7;
    uVar12 = uVar10;
    do {
      bVar5 = SUB81(uVar8,0);
      if (plen <= uVar12) break;
      cVar3 = pattern[uVar12];
      iVar7 = uVar12 + 1;
      if (cVar3 == ']' && uVar10 < uVar12) {
        bVar11 = true;
        goto LAB_014dcf0d;
      }
      if (iVar7 == plen) break;
      if (pattern[iVar7] == '-') {
        if (uVar12 + 2 != plen) {
          bVar11 = cVar2 <= pattern[uVar12 + 2] && cVar3 <= cVar2;
          iVar7 = uVar12 + 3;
          goto LAB_014dced4;
        }
        bVar11 = false;
        iVar7 = uVar12;
      }
      else {
        bVar11 = cVar3 == cVar2;
LAB_014dced4:
        uVar12 = (ulong)(cVar1 != '!');
        if (!bVar11) {
          uVar12 = uVar8;
        }
        if ((cVar1 == '!') != bVar5) {
          uVar12 = uVar8;
        }
        uVar8 = uVar12;
        bVar11 = true;
      }
      bVar5 = SUB81(uVar8,0);
      uVar12 = iVar7;
    } while (bVar11);
    bVar11 = false;
    iVar7 = uVar12;
LAB_014dcf0d:
    if ((bVar11) && (bVar5 != false)) {
      iVar13 = iVar13 + 1;
      bVar5 = true;
    }
    else {
      bVar5 = false;
      uVar6 = 0;
    }
    bVar14 = (byte)uVar6;
    uVar12 = iVar13;
  } while (bVar5);
  goto LAB_014dcf53;
  while (iVar7 = iVar7 + 1, uVar6 = plen, plen != iVar7) {
LAB_014dcf31:
    uVar6 = iVar7;
    if (pattern[iVar7] != '*') break;
  }
LAB_014dcf43:
  bVar14 = slen == uVar12 && uVar6 == plen;
LAB_014dcf53:
  return (bool)(bVar14 & 1);
}

Assistant:

bool Glob(const char *string, idx_t slen, const char *pattern, idx_t plen, bool allow_question_mark) {
	idx_t sidx = 0;
	idx_t pidx = 0;
main_loop : {
	// main matching loop
	while (sidx < slen && pidx < plen) {
		char s = string[sidx];
		char p = pattern[pidx];
		switch (p) {
		case '*': {
			// asterisk: match any set of characters
			// skip any subsequent asterisks
			pidx++;
			while (pidx < plen && pattern[pidx] == '*') {
				pidx++;
			}
			// if the asterisk is the last character, the pattern always matches
			if (pidx == plen) {
				return true;
			}
			// recursively match the remainder of the pattern
			for (; sidx < slen; sidx++) {
				if (Glob(string + sidx, slen - sidx, pattern + pidx, plen - pidx)) {
					return true;
				}
			}
			return false;
		}
		case '?':
			// when enabled: matches anything but null
			if (allow_question_mark) {
				break;
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		case '[':
			pidx++;
			goto parse_bracket;
		case '\\':
			// escape character, next character needs to match literally
			pidx++;
			// check that we still have a character remaining
			if (pidx == plen) {
				return false;
			}
			p = pattern[pidx];
			if (s != p) {
				return false;
			}
			break;
		default:
			// not a control character: characters need to match literally
			if (s != p) {
				return false;
			}
			break;
		}
		sidx++;
		pidx++;
	}
	while (pidx < plen && pattern[pidx] == '*') {
		pidx++;
	}
	// we are finished only if we have consumed the full pattern
	return pidx == plen && sidx == slen;
}
parse_bracket : {
	// inside a bracket
	if (pidx == plen) {
		return false;
	}
	// check the first character
	// if it is an exclamation mark we need to invert our logic
	char p = pattern[pidx];
	char s = string[sidx];
	bool invert = false;
	if (p == '!') {
		invert = true;
		pidx++;
	}
	bool found_match = invert;
	idx_t start_pos = pidx;
	bool found_closing_bracket = false;
	// now check the remainder of the pattern
	while (pidx < plen) {
		p = pattern[pidx];
		// if the first character is a closing bracket, we match it literally
		// otherwise it indicates an end of bracket
		if (p == ']' && pidx > start_pos) {
			// end of bracket found: we are done
			found_closing_bracket = true;
			pidx++;
			break;
		}
		// we either match a range (a-b) or a single character (a)
		// check if the next character is a dash
		if (pidx + 1 == plen) {
			// no next character!
			break;
		}
		bool matches;
		if (pattern[pidx + 1] == '-') {
			// range! find the next character in the range
			if (pidx + 2 == plen) {
				break;
			}
			char next_char = pattern[pidx + 2];
			// check if the current character is within the range
			matches = s >= p && s <= next_char;
			// shift the pattern forward past the range
			pidx += 3;
		} else {
			// no range! perform a direct match
			matches = p == s;
			// shift the pattern forward past the character
			pidx++;
		}
		if (found_match == invert && matches) {
			// found a match! set the found_matches flag
			// we keep on pattern matching after this until we reach the end bracket
			// however, we don't need to update the found_match flag anymore
			found_match = !invert;
		}
	}
	if (!found_closing_bracket) {
		// no end of bracket: invalid pattern
		return false;
	}
	if (!found_match) {
		// did not match the bracket: return false;
		return false;
	}
	// finished the bracket matching: move forward
	sidx++;
	goto main_loop;
}
}